

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

void __thiscall CTcConstVal::set_list(CTcConstVal *this,CTPNList *lst)

{
  CTcGenTarg *in_RSI;
  undefined4 *in_RDI;
  CTcGenTarg *element_count;
  
  *in_RDI = 6;
  *(CTcGenTarg **)(in_RDI + 2) = in_RSI;
  element_count = G_cg;
  CTPNListBase::get_count((CTPNListBase *)in_RSI);
  CTcGenTarg::note_list(in_RSI,(size_t)element_count);
  return;
}

Assistant:

void CTcConstVal::set_list(CTPNList *lst)
{
    /* set the type */
    typ_ = TC_CVT_LIST;

    /* remember the list */
    val_.listval_.l_ = lst;

    /* for image file layout purposes, record the length of this list */
    G_cg->note_list(lst->get_count());
}